

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O0

void __thiscall
beagle::cpu::BeagleCPU4StateImpl<float,_1,_0>::calcPrePartialsStates
          (BeagleCPU4StateImpl<float,_1,_0> *this,float *destP,float *partials1,float *matrices1,
          int *states2,float *matrices2,int startPattern,int endPattern)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  int iVar26;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  long in_R9;
  float m100;
  int w;
  int u;
  int l;
  undefined4 local_80;
  float sum13;
  float sum12;
  float sum11;
  float sum10;
  float sum23;
  float sum22;
  float sum21;
  float sum20;
  int state2;
  float p13;
  float p12;
  float p11;
  float p10;
  int k;
  float m133;
  float m132;
  float m131;
  float m130;
  float m123;
  float m122;
  float m121;
  float m120;
  float m113;
  float m112;
  float m111;
  float m110;
  float m103;
  float m102;
  float m101;
  
  for (m131 = 0.0; (int)m131 < *(int *)(in_RDI + 0x34); m131 = (float)((int)m131 + 1)) {
    m132 = (float)((int)m131 * 4 * *(int *)(in_RDI + 0x18));
    if (u != 0) {
      m132 = (float)(u * 4 + (int)m132);
    }
    iVar26 = (int)m131 * 0x14;
    uVar1 = *(uint *)(in_RCX + (long)iVar26 * 4);
    uVar2 = *(uint *)(in_RCX + (long)(iVar26 + 1) * 4);
    uVar3 = *(uint *)(in_RCX + (long)(iVar26 + 2) * 4);
    uVar4 = *(uint *)(in_RCX + (long)(iVar26 + 3) * 4);
    fVar5 = *(float *)(in_RCX + (long)(iVar26 + 5) * 4);
    fVar6 = *(float *)(in_RCX + (long)(iVar26 + 6) * 4);
    fVar7 = *(float *)(in_RCX + (long)(iVar26 + 7) * 4);
    fVar8 = *(float *)(in_RCX + (long)(iVar26 + 8) * 4);
    uVar9 = *(uint *)(in_RCX + (long)(iVar26 + 10) * 4);
    uVar10 = *(uint *)(in_RCX + (long)(iVar26 + 0xb) * 4);
    uVar11 = *(uint *)(in_RCX + (long)(iVar26 + 0xc) * 4);
    uVar12 = *(uint *)(in_RCX + (long)(iVar26 + 0xd) * 4);
    uVar13 = *(uint *)(in_RCX + (long)(iVar26 + 0xf) * 4);
    uVar14 = *(uint *)(in_RCX + (long)(iVar26 + 0x10) * 4);
    uVar15 = *(uint *)(in_RCX + (long)(iVar26 + 0x11) * 4);
    uVar16 = *(uint *)(in_RCX + (long)(iVar26 + 0x12) * 4);
    for (local_80 = u; local_80 < (int)matrices2; local_80 = local_80 + 1) {
      iVar17 = *(int *)(in_R8 + (long)local_80 * 4);
      fVar18 = *(float *)(in_RDX + (long)(int)m132 * 4) *
               *(float *)(in_R9 + (long)(iVar26 + iVar17) * 4);
      fVar19 = *(float *)(in_RDX + (long)((int)m132 + 1) * 4) *
               *(float *)(in_R9 + (long)(iVar26 + iVar17 + 5) * 4);
      fVar20 = *(float *)(in_RDX + (long)((int)m132 + 2) * 4) *
               *(float *)(in_R9 + (long)(iVar26 + iVar17 + 10) * 4);
      fVar21 = *(float *)(in_RDX + (long)((int)m132 + 3) * 4) *
               *(float *)(in_R9 + (long)(iVar26 + iVar17 + 0xf) * 4);
      auVar22 = vfmadd213ss_fma(ZEXT416((uint)fVar18),ZEXT416(uVar1),ZEXT416((uint)(fVar5 * fVar19))
                               );
      auVar22 = vfmadd213ss_fma(ZEXT416((uint)fVar20),ZEXT416(uVar9),auVar22);
      auVar22 = vfmadd213ss_fma(ZEXT416((uint)fVar21),ZEXT416(uVar13),auVar22);
      auVar23 = vfmadd213ss_fma(ZEXT416((uint)fVar18),ZEXT416(uVar2),ZEXT416((uint)(fVar6 * fVar19))
                               );
      auVar23 = vfmadd213ss_fma(ZEXT416((uint)fVar20),ZEXT416(uVar10),auVar23);
      auVar23 = vfmadd213ss_fma(ZEXT416((uint)fVar21),ZEXT416(uVar14),auVar23);
      auVar24 = vfmadd213ss_fma(ZEXT416((uint)fVar18),ZEXT416(uVar3),ZEXT416((uint)(fVar7 * fVar19))
                               );
      auVar24 = vfmadd213ss_fma(ZEXT416((uint)fVar20),ZEXT416(uVar11),auVar24);
      auVar24 = vfmadd213ss_fma(ZEXT416((uint)fVar21),ZEXT416(uVar15),auVar24);
      auVar25 = vfmadd213ss_fma(ZEXT416((uint)fVar18),ZEXT416(uVar4),ZEXT416((uint)(fVar8 * fVar19))
                               );
      auVar25 = vfmadd213ss_fma(ZEXT416((uint)fVar20),ZEXT416(uVar12),auVar25);
      auVar25 = vfmadd213ss_fma(ZEXT416((uint)fVar21),ZEXT416(uVar16),auVar25);
      *(int *)(in_RSI + (long)(int)m132 * 4) = auVar22._0_4_;
      *(int *)(in_RSI + (long)((int)m132 + 1) * 4) = auVar23._0_4_;
      *(int *)(in_RSI + (long)((int)m132 + 2) * 4) = auVar24._0_4_;
      *(int *)(in_RSI + (long)((int)m132 + 3) * 4) = auVar25._0_4_;
      m132 = (float)((int)m132 + 4);
    }
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::calcPrePartialsStates(REALTYPE* destP,
                                                                    const REALTYPE* partials1,
                                                                    const REALTYPE* matrices1,
                                                                    const int* states2,
                                                                    const REALTYPE* matrices2,
                                                                    int startPattern,
                                                                    int endPattern) {


#pragma omp parallel for num_threads(kCategoryCount)
    for (int l = 0; l < kCategoryCount; l++) {
        int u = l*4*kPaddedPatternCount;
        if (startPattern != 0) {
            u += 4*startPattern;
        }
        int w = l*4*OFFSET;


        PREFETCH_MATRIX_TRANSPOSE(1, matrices1, w); //m100, m101, ..., m133
        for (int k = startPattern; k < endPattern; k++) {
            PREFETCH_PARTIALS(1, partials1, u); // p10, p11, p12, p13

            const int state2 = states2[k];
            PREFETCH_MATRIX_COLUMN(2, matrices2, w + state2); // sum20, sum21, sum22, sum23

            DO_SCHUR_PRODUCT(1, 1, 2); // reWrites p10, p11, p12, p13

            DO_INTEGRATION(1); // defines sum10, sum11, sum12, sum13

            // Final results
            destP[u] = sum10;
            destP[u + 1] = sum11;
            destP[u + 2] = sum12;
            destP[u + 3] = sum13;

            u += 4;

        }
    }
}